

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *kernel)

{
  Index end;
  long start;
  undefined8 local_30;
  Index index;
  Index alignedEnd;
  Index alignedStart;
  Index size;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *kernel_local;
  
  end = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
        ::size(kernel);
  start = (end / 2) * 2;
  unaligned_dense_assignment_loop<true>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>>,Eigen::internal::assign_op<double,double>,0>>
            (kernel,0,0);
  for (local_30 = 0; local_30 < start; local_30 = local_30 + 2) {
    generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,-1,0,-1,-1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,-1,0,-1,-1>const>const>>,Eigen::internal::assign_op<double,double>,0>
    ::assignPacket<16,16,double__vector(2)>
              ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>>,Eigen::internal::assign_op<double,double>,0>
                *)kernel,local_30);
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>>,Eigen::internal::assign_op<double,double>,0>>
            (kernel,start,end);
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    const Index size = kernel.size();
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      requestedAlignment = Kernel::AssignmentTraits::LinearRequiredAlignment,
      packetSize = unpacket_traits<PacketType>::size,
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = packet_traits<Scalar>::AlignedOnScalar ? int(requestedAlignment)
                                                            : int(Kernel::AssignmentTraits::DstAlignment),
      srcAlignment = Kernel::AssignmentTraits::JointAlignment
    };
    const Index alignedStart = dstIsAligned ? 0 : internal::first_aligned<requestedAlignment>(kernel.dstDataPtr(), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_dense_assignment_loop<dstIsAligned!=0>::run(kernel, 0, alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
      kernel.template assignPacket<dstAlignment, srcAlignment, PacketType>(index);

    unaligned_dense_assignment_loop<>::run(kernel, alignedEnd, size);
  }